

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

size_t get_next_version_component(char **str,component_t *component,int flags)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *cur;
  byte *pbVar5;
  char *pcVar6;
  byte bVar7;
  size_t sStack_40;
  
  for (pbVar5 = (byte *)*str;
      ((bVar7 = *pbVar5, (byte)(bVar7 - 0x3a) < 0xf6 && (bVar7 != 0)) &&
      (0x19 < (byte)((bVar7 & 0xdf) + 0xbf))); pbVar5 = pbVar5 + 1) {
  }
  *str = (char *)pbVar5;
  bVar7 = *pbVar5;
  if (bVar7 == 0) {
    uVar4 = 0;
    if ((flags & 4U) == 0) {
      uVar4 = (flags & 8U) >> 1 | 2;
    }
    component->metaorder = uVar4;
    component->start = "";
    component->end = "";
    sStack_40 = 1;
  }
  else {
    if ((byte)((bVar7 & 0xdf) + 0xa5) < 0xe6) {
      while (bVar7 == 0x30) {
        pbVar1 = pbVar5 + 1;
        pbVar5 = pbVar5 + 1;
        bVar7 = *pbVar1;
      }
      *str = (char *)pbVar5;
      component->start = (char *)pbVar5;
      pcVar6 = *str + -1;
      do {
        pcVar2 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
      } while (0xf5 < (byte)(*pcVar2 - 0x3aU));
      *str = pcVar6;
      component->end = pcVar6;
      iVar3 = (uint)(pcVar6 != component->start) * 2 + 2;
    }
    else {
      component->start = (char *)pbVar5;
      pcVar6 = skip_alpha(*str);
      *str = pcVar6;
      component->end = pcVar6;
      iVar3 = classify_keyword(component->start,pcVar6,flags);
      if (iVar3 == 2) {
        iVar3 = 3;
      }
      else if (iVar3 != 1) {
        iVar3 = (flags & 2U) + 1;
      }
    }
    component->metaorder = iVar3;
    pbVar5 = (byte *)*str;
    sStack_40 = 1;
    if (0xe5 < (byte)((*pbVar5 & 0xdf) + 0xa5)) {
      component[1].start = (char *)pbVar5;
      pcVar6 = skip_alpha(*str);
      component[1].end = pcVar6;
      if ((byte)(*pcVar6 - 0x3aU) < 0xf6) {
        uVar4 = classify_keyword((char *)pbVar5,pcVar6,flags);
        component[1].metaorder = *(int *)(&DAT_00102144 + (ulong)uVar4 * 4);
        *str = pcVar6;
        sStack_40 = 2;
      }
    }
  }
  return sStack_40;
}

Assistant:

size_t get_next_version_component(const char** str, component_t* component, int flags) {
	*str = skip_separator(*str);

	if (**str == '\0') {
		make_default_component(component, flags);
		return 1;
	}

	parse_token_to_component(str, component, flags);

	/* Special case for letter suffix:
	 * - We taste whether the next component is alpha not followed by a number,
	 *   e.g 1a, 1a.1, but not 1a1
	 * - We check whether it's known keyword (in which case it's treated normally)
	 * - Otherwise, it's treated as letter suffix
	 */
	if (my_isalpha(**str)) {
		++component;

		component->start = *str;
		component->end = skip_alpha(*str);

		if (!my_isnumber(*component->end)) {
			switch (classify_keyword(component->start, component->end, flags)) {
			case KEYWORD_UNKNOWN:
				component->metaorder = METAORDER_LETTER_SUFFIX;
				break;
			case KEYWORD_PRE_RELEASE:
				component->metaorder = METAORDER_PRE_RELEASE;
				break;
			case KEYWORD_POST_RELEASE:
				component->metaorder = METAORDER_POST_RELEASE;
				break;
			}

			*str = component->end;
			return 2;
		}
	}

	return 1;
}